

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O0

TlvPtr __thiscall
ot::commissioner::tlv::GetTlv(tlv *this,Type aTlvType,ByteArray *aBuf,Scope aScope)

{
  bool bVar1;
  mapped_type *pmVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TlvPtr TVar3;
  ErrorCode local_98 [4];
  Error local_88;
  undefined1 local_59;
  undefined1 local_58 [8];
  TlvSet tlvSet;
  Scope aScope_local;
  ByteArray *aBuf_local;
  tlv *ptStack_10;
  Type aTlvType_local;
  TlvPtr *ret;
  
  tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = aScope;
  aBuf_local._7_1_ = aTlvType;
  ptStack_10 = this;
  std::
  map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::map((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
         *)local_58);
  local_59 = 0;
  std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
            ((shared_ptr<ot::commissioner::tlv::Tlv> *)this,(nullptr_t)0x0);
  GetTlvSet(&local_88,(TlvSet *)local_58,aBuf,
            tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_);
  local_98[0] = kNone;
  bVar1 = commissioner::operator!=(&local_88,local_98);
  Error::~Error(&local_88);
  if (!bVar1) {
    pmVar2 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)local_58,(key_type *)((long)&aBuf_local + 7));
    std::shared_ptr<ot::commissioner::tlv::Tlv>::operator=
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)this,pmVar2);
  }
  local_59 = 1;
  std::
  map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~map((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
          *)local_58);
  TVar3.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  TVar3.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (TlvPtr)TVar3.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TlvPtr GetTlv(tlv::Type aTlvType, const ByteArray &aBuf, Scope aScope)
{
    TlvSet tlvSet;
    TlvPtr ret = nullptr;

    SuccessOrExit(GetTlvSet(tlvSet, aBuf, aScope));

    ret = tlvSet[aTlvType];

exit:
    return ret;
}